

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow
          (LayoutTests *this)

{
  long lVar1;
  box_r box1;
  factory_ptr f;
  box_r box3;
  box_r box2;
  layout l3;
  layout l2;
  layout l1;
  char_to_index indices [4];
  allocator local_27d;
  float local_27c;
  string local_278;
  box_r local_258;
  undefined1 local_250 [16];
  box_r local_240;
  box_r local_238;
  richtext_t local_230;
  layout local_1c8;
  layout local_178;
  layout local_128;
  undefined1 local_d8 [40];
  double local_b0;
  double dStack_a8;
  pointer local_a0;
  pointer ppStack_98;
  pointer local_90;
  double local_88;
  double dStack_80;
  pointer local_78;
  pointer ppStack_70;
  pointer local_68;
  double local_60;
  double dStack_58;
  pointer local_50;
  pointer ppStack_48;
  pointer local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_d8._16_8_ = (pointer)0x200000042;
  local_d8._24_8_ = (pointer)0x300000043;
  local_d8._0_8_ = 1.58101006669199e-322;
  local_d8._8_8_ = 2.12199582307954e-314;
  local_d8._32_8_ = (pointer)0x401c666666666666;
  local_b0 = 0.0;
  dStack_a8 = 0.0;
  local_a0 = (pointer)0x0;
  ppStack_98 = (pointer)0x0;
  local_90 = (pointer)0x4026000000000000;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_78 = (pointer)0x0;
  ppStack_70 = (pointer)0x0;
  local_68 = (pointer)0x402a000000000000;
  local_60 = 0.0;
  dStack_58 = 0.0;
  local_50 = (pointer)0x0;
  ppStack_48 = (pointer)0x0;
  local_40 = (pointer)0x4031000000000000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_250,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])local_d8);
  layout::layout(&local_128);
  layout::layout(&local_178);
  layout::layout(&local_1c8);
  std::__cxx11::string::string((string *)&local_278,"ABC CBA AB\nABB BBC\n",(allocator *)&local_258)
  ;
  R(&local_230,&local_278);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_128,&local_230,local_250._0_8_);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string
            ((string *)&local_278,"AC CB\nA AB\nABB BBC\n",(allocator *)&local_258);
  R(&local_230,&local_278);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_178,&local_230,local_250._0_8_);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string((string *)&local_278,"AC CB\nA AB\nABB BBC",(allocator *)&local_258);
  R(&local_230,&local_278);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_1c8,&local_230,local_250._0_8_);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  local_258 = local_128._box;
  local_238 = local_178._box;
  local_240 = local_1c8._box;
  local_27c = 120.2;
  std::__cxx11::string::string
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_27d);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_230,&local_278,0xcf);
  ut::are_equal<float,float>(&local_27c,&local_258.w,(LocationInfo *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  local_27c = 87.1;
  std::__cxx11::string::string
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_27d);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_230,&local_278,0xd0);
  ut::are_equal<float,float>(&local_27c,&local_238.w,(LocationInfo *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  local_27c = 87.1;
  std::__cxx11::string::string
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_27d);
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_230,&local_278,0xd1);
  ut::are_equal<float,float>(&local_27c,&local_240.w,(LocationInfo *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_278);
  layout::~layout(&local_1c8);
  layout::~layout(&local_178);
  layout::~layout(&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
  lVar1 = 0x88;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )(local_d8 + lVar1 + 0x20));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("ABC CBA AB\nABB BBC\n"), limit::none(), *f);
				l2.process(R("AC CB\nA AB\nABB BBC\n"), limit::none(), *f);
				l3.process(R("AC CB\nA AB\nABB BBC"), limit::none(), *f); // Last row will be checked even if no newline is encountered.

				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(120.2f, box1.w);
				assert_equal(87.1f, box2.w);
				assert_equal(87.1f, box3.w);
			}